

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::NodeLoader::data__skeleton(NodeLoader *this,URI *value)

{
  list<COLLADABU::URI,_std::allocator<COLLADABU::URI>_> *in_RSI;
  value_type *in_RDI;
  
  if (in_RDI[1].mUriString.field_2._M_allocated_capacity != 0) {
    std::__cxx11::list<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>::push_back(in_RSI,in_RDI);
    COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>::skeletons
              (*(InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431> **)
                (in_RDI[1].mUriString.field_2._M_allocated_capacity + 0x18));
    std::vector<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>::push_back
              ((vector<COLLADABU::URI,_std::allocator<COLLADABU::URI>_> *)in_RSI,in_RDI);
  }
  return true;
}

Assistant:

bool NodeLoader::data__skeleton( COLLADABU::URI value )
	{
		if (mCurrentInstanceControllerData)
		{
			mCurrentInstanceControllerData->skeletonRoots.push_back( value );
            mCurrentInstanceControllerData->instanceController->skeletons().push_back( value );
		}

		return true;
	}